

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memarena.cpp
# Opt level: O1

Node * __thiscall
FSharedStringArena::FindString(FSharedStringArena *this,char *str,size_t strlen,uint *hash)

{
  char *__s1;
  DWORD DVar1;
  int iVar2;
  Node *pNVar3;
  
  DVar1 = SuperFastHash(str,strlen);
  *hash = DVar1;
  pNVar3 = this->Buckets[DVar1 & 0xff];
  while( true ) {
    if (pNVar3 == (Node *)0x0) {
      return (Node *)0x0;
    }
    if (((pNVar3->Hash == DVar1) &&
        (__s1 = (pNVar3->String).Chars, *(uint *)(__s1 + -0xc) == strlen)) &&
       (iVar2 = bcmp(__s1,str,strlen), iVar2 == 0)) break;
    pNVar3 = pNVar3->Next;
  }
  return pNVar3;
}

Assistant:

FSharedStringArena::Node *FSharedStringArena::FindString(const char *str, size_t strlen, unsigned int &hash)
{
	hash = SuperFastHash(str, strlen);

	for (Node *node = Buckets[hash % countof(Buckets)]; node != NULL; node = node->Next)
	{
		if (node->Hash == hash && node->String.Len() == strlen && memcmp(&node->String[0], str, strlen) == 0)
		{
			return node;
		}
	}
	return NULL;
}